

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::TcParseFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,TcParseFunction func)

{
  string *psVar1;
  AlphaNum *b;
  undefined8 local_60;
  char *local_58;
  AlphaNum local_30;
  
  if ((byte)this < 0x7c) {
    local_60 = 0x12;
    local_58 = "::_pbi::TcParser::";
    b = (AlphaNum *)(ulong)(((uint)this & 0xff) << 4);
    local_30.piece_._M_len = *(size_t *)b[0x859af].digits_;
    local_30.piece_._M_str = *(char **)(b[0x859af].digits_ + 8);
    psVar1 = absl::lts_20250127::StrCat_abi_cxx11_
                       (__return_storage_ptr__,(lts_20250127 *)&local_60,&local_30,b);
    return psVar1;
  }
  TcParseFunctionName_abi_cxx11_();
}

Assistant:

static std::string TcParseFunctionName(internal::TcParseFunction func) {
#define PROTOBUF_TC_PARSE_FUNCTION_X(value) #value,
  static constexpr absl::string_view kNames[] = {
      {}, PROTOBUF_TC_PARSE_FUNCTION_LIST};
#undef PROTOBUF_TC_PARSE_FUNCTION_X
  const int func_index = static_cast<int>(func);
  ABSL_CHECK_GE(func_index, 0);
  ABSL_CHECK_LT(func_index, std::end(kNames) - std::begin(kNames));
  static constexpr absl::string_view ns = "::_pbi::TcParser::";
  return absl::StrCat(ns, kNames[func_index]);
}